

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.hpp
# Opt level: O0

string * Log::FormatTime_abi_cxx11_(void)

{
  string *in_RDI;
  allocator local_89;
  char local_88 [8];
  char buf [100];
  tm *tm;
  time_t t;
  
  stack0xffffffffffffffe0 = (tm *)0x0;
  time((time_t *)&tm);
  register0x00000000 = localtime((time_t *)&tm);
  sprintf(local_88,"%04d-%02d-%02d %02d:%02d:%02d",(ulong)(register0x00000000->tm_year + 0x76c),
          (ulong)(register0x00000000->tm_mon + 1),(ulong)(uint)register0x00000000->tm_mday,
          (ulong)(uint)register0x00000000->tm_hour,register0x00000000->tm_min,
          register0x00000000->tm_sec);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,local_88,&local_89);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  return in_RDI;
}

Assistant:

static std::string FormatTime()
    {
        time_t t;
        struct tm *tm = NULL;

        time(&t);
        tm = localtime(&t);
        char buf[100];
        sprintf(buf, "%04d-%02d-%02d %02d:%02d:%02d",
                tm->tm_year + 1900, tm->tm_mon + 1, tm->tm_mday,
                tm->tm_hour, tm->tm_min, tm->tm_sec);
        return std::string(buf);
    }